

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

array_container_t * array_container_create_given_capacity(int32_t size)

{
  array_container_t *__ptr;
  uint16_t *puVar1;
  
  __ptr = (array_container_t *)roaring_malloc(0x10);
  if (__ptr == (array_container_t *)0x0) {
LAB_0011f6c4:
    __ptr = (array_container_t *)0x0;
  }
  else {
    if (size < 1) {
      __ptr->array = (uint16_t *)0x0;
    }
    else {
      puVar1 = (uint16_t *)roaring_malloc((ulong)(uint)(size * 2));
      __ptr->array = puVar1;
      if (puVar1 == (uint16_t *)0x0) {
        roaring_free(__ptr);
        goto LAB_0011f6c4;
      }
    }
    __ptr->capacity = size;
    __ptr->cardinality = 0;
  }
  return __ptr;
}

Assistant:

array_container_t *array_container_create_given_capacity(int32_t size) {
    array_container_t *container;

    if ((container = (array_container_t *)roaring_malloc(
             sizeof(array_container_t))) == NULL) {
        return NULL;
    }

    if (size <= 0) {  // we don't want to rely on malloc(0)
        container->array = NULL;
    } else if ((container->array = (uint16_t *)roaring_malloc(sizeof(uint16_t) *
                                                              size)) == NULL) {
        roaring_free(container);
        return NULL;
    }

    container->capacity = size;
    container->cardinality = 0;

    return container;
}